

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeMakeReady(Vdbe *p,Parse *pParse)

{
  short sVar1;
  ushort uVar2;
  int iVar3;
  Op *pOVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  sqlite3 *psVar8;
  ushort uVar9;
  long lVar10;
  long lVar11;
  Mem *pMVar12;
  void *pvVar13;
  VdbeCursor **ppVVar14;
  int N;
  long lVar15;
  ulong uVar16;
  Mem *pMVar17;
  Mem **ppMVar18;
  int iVar19;
  size_t __n;
  u64 uVar20;
  long lVar21;
  long lVar22;
  u64 uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  int nArg;
  sqlite3 *local_40;
  long local_38;
  
  local_40 = p->db;
  sVar1 = pParse->nVar;
  lVar10 = (long)sVar1;
  iVar3 = pParse->nTab;
  lVar15 = (long)iVar3;
  nArg = pParse->nMaxArg;
  iVar19 = pParse->nMem + iVar3;
  iVar19 = (uint)(0 < iVar19 && lVar15 == 0) + iVar19;
  lVar11 = (long)(p->nOp * 0x18);
  pOVar4 = p->aOp;
  uVar24 = pParse->szOpAlloc - lVar11 & 0xfffffffffffffff8;
  resolveP2Values(p,&nArg);
  psVar8 = local_40;
  if (pParse->isMultiWrite == '\0') {
    uVar9 = 0;
  }
  else {
    uVar9 = (ushort)(pParse->mayAbort != '\0') << 7;
  }
  uVar2 = *(ushort *)&p->field_0xc5;
  *(ushort *)&p->field_0xc5 = uVar9 | uVar2 & 0xff7f;
  N = 10;
  if (10 < iVar19) {
    N = iVar19;
  }
  if (pParse->explain == '\0') {
    N = iVar19;
  }
  *(ushort *)&p->field_0xc5 = uVar9 | uVar2 & 0xff7c;
  local_38 = (long)N * 0x38;
  pMVar12 = (Mem *)0x0;
  uVar16 = uVar24 + (long)N * -0x38;
  pMVar17 = (Mem *)((long)pOVar4 + uVar16 + lVar11);
  lVar5 = 0;
  if (SBORROW8(uVar24,local_38) != (long)uVar16 < 0) {
    pMVar17 = pMVar12;
    lVar5 = local_38;
    uVar16 = uVar24;
  }
  p->aMem = pMVar17;
  lVar22 = lVar10 * 0x38;
  uVar24 = uVar16 + lVar10 * -0x38;
  pMVar17 = (Mem *)((long)pOVar4 + uVar24 + lVar11);
  lVar6 = 0;
  if (SBORROW8(uVar16,lVar22) != (long)uVar24 < 0) {
    pMVar17 = pMVar12;
    lVar6 = lVar22;
    uVar24 = uVar16;
  }
  p->aVar = pMVar17;
  lVar25 = (long)nArg;
  lVar26 = lVar25 * 8;
  uVar16 = uVar24 + lVar25 * -8;
  lVar21 = 0;
  if ((long)uVar24 < lVar26) {
    lVar21 = lVar26;
  }
  pMVar17 = (Mem *)((long)pOVar4 + uVar16 + lVar11);
  if (SBORROW8(uVar24,lVar26) != (long)uVar16 < 0) {
    pMVar17 = pMVar12;
    uVar16 = uVar24;
  }
  p->apArg = (Mem **)pMVar17;
  __n = lVar15 * 8;
  pMVar17 = (Mem *)((long)pOVar4 + uVar16 + lVar15 * -8 + lVar11);
  sVar7 = 0;
  if ((long)uVar16 < (long)__n) {
    pMVar17 = pMVar12;
    sVar7 = __n;
  }
  p->apCsr = (VdbeCursor **)pMVar17;
  uVar23 = sVar7 + lVar21 + lVar6 + lVar5;
  if (uVar23 != 0) {
    pvVar13 = sqlite3DbMallocRawNN(local_40,uVar23);
    p->pFree = pvVar13;
    if (psVar8->mallocFailed == '\0') {
      pMVar17 = p->aMem;
      uVar20 = uVar23;
      if (pMVar17 == (Mem *)0x0) {
        uVar20 = uVar23 - local_38;
        if ((long)uVar23 < local_38) {
          pMVar17 = (Mem *)0x0;
          uVar20 = uVar23;
        }
        else {
          pMVar17 = (Mem *)((long)pvVar13 + uVar20);
        }
      }
      p->aMem = pMVar17;
      pMVar17 = p->aVar;
      uVar23 = uVar20;
      if (pMVar17 == (Mem *)0x0) {
        uVar23 = uVar20 + lVar10 * -0x38;
        if ((long)uVar20 < lVar22) {
          pMVar17 = (Mem *)0x0;
          uVar23 = uVar20;
        }
        else {
          pMVar17 = (Mem *)((long)pvVar13 + uVar23);
        }
      }
      p->aVar = pMVar17;
      ppMVar18 = p->apArg;
      uVar20 = uVar23;
      if (ppMVar18 == (Mem **)0x0) {
        uVar20 = uVar23 + lVar25 * -8;
        if ((long)uVar23 < lVar26) {
          ppMVar18 = (Mem **)0x0;
          uVar20 = uVar23;
        }
        else {
          ppMVar18 = (Mem **)((long)pvVar13 + uVar20);
        }
      }
      p->apArg = ppMVar18;
      ppVVar14 = p->apCsr;
      if (ppVVar14 == (VdbeCursor **)0x0) {
        if ((long)uVar20 < (long)__n) {
          ppVVar14 = (VdbeCursor **)0x0;
        }
        else {
          ppVVar14 = (VdbeCursor **)((long)pvVar13 + uVar20 + lVar15 * -8);
        }
      }
      p->apCsr = ppVVar14;
    }
  }
  psVar8 = local_40;
  p->pVList = pParse->pVList;
  pParse->pVList = (VList *)0x0;
  *(ushort *)&p->field_0xc5 = (*(ushort *)&p->field_0xc5 & 0xfff3) + (pParse->explain & 3) * 4;
  if (local_40->mallocFailed == '\0') {
    p->nCursor = iVar3;
    p->nVar = sVar1;
    initMemArray(p->aVar,(int)sVar1,local_40,1);
    p->nMem = N;
    initMemArray(p->aMem,N,psVar8,0x80);
    memset(p->apCsr,0,__n);
  }
  else {
    p->nVar = 0;
    p->nMem = 0;
    p->nCursor = 0;
  }
  sqlite3VdbeRewind(p);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMakeReady(
  Vdbe *p,                       /* The VDBE */
  Parse *pParse                  /* Parsing context */
){
  sqlite3 *db;                   /* The database connection */
  int nVar;                      /* Number of parameters */
  int nMem;                      /* Number of VM memory registers */
  int nCursor;                   /* Number of cursors required */
  int nArg;                      /* Number of arguments in subprograms */
  int n;                         /* Loop counter */
  struct ReusableSpace x;        /* Reusable bulk memory */

  assert( p!=0 );
  assert( p->nOp>0 );
  assert( pParse!=0 );
  assert( p->magic==VDBE_MAGIC_INIT );
  assert( pParse==p->pParse );
  db = p->db;
  assert( db->mallocFailed==0 );
  nVar = pParse->nVar;
  nMem = pParse->nMem;
  nCursor = pParse->nTab;
  nArg = pParse->nMaxArg;
  
  /* Each cursor uses a memory cell.  The first cursor (cursor 0) can
  ** use aMem[0] which is not otherwise used by the VDBE program.  Allocate
  ** space at the end of aMem[] for cursors 1 and greater.
  ** See also: allocateCursor().
  */
  nMem += nCursor;
  if( nCursor==0 && nMem>0 ) nMem++;  /* Space for aMem[0] even if not used */

  /* Figure out how much reusable memory is available at the end of the
  ** opcode array.  This extra memory will be reallocated for other elements
  ** of the prepared statement.
  */
  n = ROUND8(sizeof(Op)*p->nOp);              /* Bytes of opcode memory used */
  x.pSpace = &((u8*)p->aOp)[n];               /* Unused opcode memory */
  assert( EIGHT_BYTE_ALIGNMENT(x.pSpace) );
  x.nFree = ROUNDDOWN8(pParse->szOpAlloc - n);  /* Bytes of unused memory */
  assert( x.nFree>=0 );
  assert( EIGHT_BYTE_ALIGNMENT(&x.pSpace[x.nFree]) );

  resolveP2Values(p, &nArg);
  p->usesStmtJournal = (u8)(pParse->isMultiWrite && pParse->mayAbort);
  if( pParse->explain && nMem<10 ){
    nMem = 10;
  }
  p->expired = 0;

  /* Memory for registers, parameters, cursor, etc, is allocated in one or two
  ** passes.  On the first pass, we try to reuse unused memory at the 
  ** end of the opcode array.  If we are unable to satisfy all memory
  ** requirements by reusing the opcode array tail, then the second
  ** pass will fill in the remainder using a fresh memory allocation.  
  **
  ** This two-pass approach that reuses as much memory as possible from
  ** the leftover memory at the end of the opcode array.  This can significantly
  ** reduce the amount of memory held by a prepared statement.
  */
  x.nNeeded = 0;
  p->aMem = allocSpace(&x, 0, nMem*sizeof(Mem));
  p->aVar = allocSpace(&x, 0, nVar*sizeof(Mem));
  p->apArg = allocSpace(&x, 0, nArg*sizeof(Mem*));
  p->apCsr = allocSpace(&x, 0, nCursor*sizeof(VdbeCursor*));
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
  p->anExec = allocSpace(&x, 0, p->nOp*sizeof(i64));
#endif
  if( x.nNeeded ){
    x.pSpace = p->pFree = sqlite3DbMallocRawNN(db, x.nNeeded);
    x.nFree = x.nNeeded;
    if( !db->mallocFailed ){
      p->aMem = allocSpace(&x, p->aMem, nMem*sizeof(Mem));
      p->aVar = allocSpace(&x, p->aVar, nVar*sizeof(Mem));
      p->apArg = allocSpace(&x, p->apArg, nArg*sizeof(Mem*));
      p->apCsr = allocSpace(&x, p->apCsr, nCursor*sizeof(VdbeCursor*));
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
      p->anExec = allocSpace(&x, p->anExec, p->nOp*sizeof(i64));
#endif
    }
  }

  p->pVList = pParse->pVList;
  pParse->pVList =  0;
  p->explain = pParse->explain;
  if( db->mallocFailed ){
    p->nVar = 0;
    p->nCursor = 0;
    p->nMem = 0;
  }else{
    p->nCursor = nCursor;
    p->nVar = (ynVar)nVar;
    initMemArray(p->aVar, nVar, db, MEM_Null);
    p->nMem = nMem;
    initMemArray(p->aMem, nMem, db, MEM_Undefined);
    memset(p->apCsr, 0, nCursor*sizeof(VdbeCursor*));
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
    memset(p->anExec, 0, p->nOp*sizeof(i64));
#endif
  }
  sqlite3VdbeRewind(p);
}